

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffcprw(fitsfile *infptr,fitsfile *outfptr,LONGLONG firstrow,LONGLONG nrows,int *status)

{
  LONGLONG *pLVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uchar *values;
  int iVar5;
  int *colnums;
  int *colnums_00;
  void *buffer;
  FITSfile *pFVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  void *local_d8;
  int nInVarCols;
  long local_c0;
  LONGLONG innaxis1;
  int nOutVarCols;
  uchar *local_a8;
  LONGLONG hrepeat;
  long local_98;
  size_t local_90;
  long local_88;
  long *local_80;
  LONGLONG hoffset;
  LONGLONG outnaxis2;
  int *local_68;
  size_t local_60;
  long local_58;
  long local_50;
  long local_48;
  LONGLONG outnaxis1;
  LONGLONG innaxis2;
  
  nInVarCols = 0;
  nOutVarCols = 0;
  hrepeat = 0;
  hoffset = 0;
  iVar5 = *status;
  if (iVar5 < 1) {
    if (infptr->HDUposition == infptr->Fptr->curhdu) {
      if (infptr->Fptr->datastart == -1) {
        ffrdef(infptr,status);
      }
    }
    else {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
    }
    if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
      if (outfptr->Fptr->datastart == -1) {
        ffrdef(outfptr,status);
      }
    }
    else {
      ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
    }
    iVar5 = *status;
    if (iVar5 < 1) {
      iVar5 = infptr->Fptr->hdutype;
      if ((iVar5 == 0) || (iVar4 = outfptr->Fptr->hdutype, iVar4 == 0)) {
        ffpmsg("Can not copy rows to or from IMAGE HDUs (ffcprw)");
        *status = 0xeb;
        iVar5 = 0xeb;
      }
      else if ((iVar4 == 1 && iVar5 == 2) || (iVar4 == 2 && iVar5 == 1)) {
        ffpmsg("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
        *status = 0xe3;
        iVar5 = 0xe3;
      }
      else {
        ffgkyjj(infptr,"NAXIS1",&innaxis1,(char *)0x0,status);
        ffgkyjj(infptr,"NAXIS2",&innaxis2,(char *)0x0,status);
        ffgkyjj(outfptr,"NAXIS1",&outnaxis1,(char *)0x0,status);
        ffgkyjj(outfptr,"NAXIS2",&outnaxis2,(char *)0x0,status);
        iVar5 = *status;
        if (iVar5 < 1) {
          if (outnaxis1 == innaxis1) {
            if (innaxis2 < nrows + firstrow + -1) {
              ffpmsg("Not enough rows in input table to copy (ffcprw)");
              *status = 0x133;
              iVar5 = 0x133;
            }
            else {
              iVar5 = infptr->Fptr->tfield;
              if (iVar5 == outfptr->Fptr->tfield) {
                local_a8 = (uchar *)malloc(outnaxis1);
                if (local_a8 == (uchar *)0x0) {
                  ffpmsg("Unable to allocate memory (ffcprw)");
                  *status = 0x71;
                  iVar5 = 0x71;
                }
                else {
                  sVar10 = (long)iVar5 << 2;
                  colnums = (int *)malloc(sVar10);
                  colnums_00 = (int *)malloc(sVar10);
                  fffvcl(infptr,&nInVarCols,colnums,status);
                  fffvcl(outfptr,&nOutVarCols,colnums_00,status);
                  local_68 = colnums_00;
                  if (nInVarCols == nOutVarCols) {
                    local_98 = nrows + firstrow;
                    uVar8 = 0;
                    uVar7 = 0;
                    if (0 < nInVarCols) {
                      uVar8 = (ulong)(uint)nInVarCols;
                    }
LAB_00122ea4:
                    if (uVar8 != uVar7) goto code_r0x00122ea9;
                    local_c0 = outnaxis2 + 1;
                    if (nInVarCols == 0) {
                      local_d8 = (void *)0x0;
                      for (; firstrow < local_98; firstrow = firstrow + 1) {
                        ffgtbb(infptr,firstrow,1,innaxis1,local_a8,status);
                        lVar11 = local_c0;
                        ffptbb(outfptr,local_c0,1,innaxis1,local_a8,status);
                        local_c0 = lVar11 + 1;
                      }
                    }
                    else {
                      ffirow(outfptr,outnaxis2,nrows,status);
                      local_90 = 0;
                      local_d8 = (void *)0x0;
                      for (; values = local_a8, firstrow < local_98; firstrow = firstrow + 1) {
                        ffgtbb(infptr,firstrow,1,innaxis1,local_a8,status);
                        ffptbb(outfptr,local_c0,1,innaxis1,values,status);
                        pFVar6 = infptr->Fptr;
                        plVar9 = &pFVar6->tableptr->twidth;
                        lVar12 = 0;
                        lVar11 = 0;
                        while (lVar11 < pFVar6->tfield) {
                          if (lVar12 < nInVarCols) {
                            iVar5 = colnums[lVar12];
                            lVar11 = lVar11 + 1;
                            if (lVar11 == iVar5) {
                              local_80 = plVar9;
                              local_58 = (long)iVar5;
                              local_50 = lVar11;
                              local_48 = lVar12;
                              ffgdesll(infptr,iVar5,firstrow,&hrepeat,&hoffset,status);
                              sVar10 = hrepeat;
                              if (*(int *)(local_80 + -9) != -0x10) {
                                if (*(int *)(local_80 + -9) == -1) {
                                  sVar10 = (hrepeat + 7) / 8;
                                }
                                else {
                                  sVar10 = hrepeat * *local_80;
                                }
                              }
                              pFVar6 = outfptr->Fptr;
                              local_88 = pFVar6->heapstart + pFVar6->datastart + pFVar6->heapsize;
                              ffmbyt(infptr,infptr->Fptr->heapstart + infptr->Fptr->datastart +
                                            hoffset,0,status);
                              pFVar6 = outfptr->Fptr;
                              if (pFVar6->lasthdu == 0) {
                                if ((pFVar6->headstart[(long)pFVar6->curhdu + 1] <
                                     (long)(local_88 + sVar10)) &&
                                   (iVar5 = ffiblk(outfptr,(long)(local_88 + sVar10 +
                                                                 ~pFVar6->headstart
                                                                  [(long)pFVar6->curhdu + 1]) /
                                                           0xb40 + 1,1,status), 0 < iVar5)) {
                                  ffpmsg(
                                        "Failed to extend the size of the variable length heap (ffcprw)"
                                        );
                                  goto LAB_0012324b;
                                }
                              }
                              local_60 = sVar10;
                              if (sVar10 != 0) {
                                buffer = local_d8;
                                if (((long)local_90 < (long)sVar10) &&
                                   (buffer = realloc(local_d8,sVar10), local_90 = sVar10,
                                   buffer == (void *)0x0)) {
                                  *status = 0x71;
                                  ffpmsg(
                                        "failed to allocate memory for variable column copy (ffcprw)"
                                        );
                                  goto LAB_0012324b;
                                }
                                ffgbyt(infptr,sVar10,buffer,status);
                                ffmbyt(outfptr,local_88,1,status);
                                ffpbyt(outfptr,sVar10,buffer,status);
                                local_d8 = buffer;
                              }
                              ffpdes(outfptr,(int)local_58,local_c0,hrepeat,outfptr->Fptr->heapsize,
                                     status);
                              pLVar1 = &outfptr->Fptr->heapsize;
                              *pLVar1 = *pLVar1 + local_60;
                              lVar12 = local_48 + 1;
                              pFVar6 = infptr->Fptr;
                              plVar9 = local_80;
                              lVar11 = local_50;
                            }
                          }
                          else {
                            lVar11 = lVar11 + 1;
                          }
                          plVar9 = plVar9 + 0x14;
                        }
                        local_c0 = local_c0 + 1;
                      }
                    }
                    outnaxis2 = outnaxis2 + nrows;
                    ffuky(outfptr,0x51,"NAXIS2",&outnaxis2,(char *)0x0,status);
                    goto LAB_0012324b;
                  }
LAB_00122eba:
                  ffpmsg("Input and output tables have different variable columns (ffcprw)");
                  *status = 0x12e;
                  local_d8 = (void *)0x0;
LAB_0012324b:
                  free(local_a8);
                  free(colnums);
                  free(local_68);
                  free(local_d8);
                  iVar5 = *status;
                }
              }
              else {
                ffpmsg("Input and output tables do not have same number of columns (ffcprw)");
                *status = 0x12e;
                iVar5 = 0x12e;
              }
            }
          }
          else {
            ffpmsg("Input and output tables do not have same width (ffcprw)");
            *status = 0xf1;
            iVar5 = 0xf1;
          }
        }
      }
    }
  }
  return iVar5;
code_r0x00122ea9:
  piVar3 = colnums + uVar7;
  piVar2 = colnums_00 + uVar7;
  uVar7 = uVar7 + 1;
  if (*piVar3 != *piVar2) goto LAB_00122eba;
  goto LAB_00122ea4;
}

Assistant:

int ffcprw(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           LONGLONG firstrow,   /* I - number of first row to copy (1 based)  */
           LONGLONG nrows,      /* I - number of rows to copy  */
           int *status)         /* IO - error status     */
/*
  copy consecutive set of rows from infptr and append it in the outfptr table.
*/
{
    LONGLONG innaxis1, innaxis2, outnaxis1, outnaxis2, ii, jj, icol;
    LONGLONG iVarCol, inPos, outPos, nVarBytes, nVarAllocBytes = 0;
    unsigned char *buffer, *varColBuff=0;
    int nInVarCols=0, nOutVarCols=0, varColDiff=0;
    int *inVarCols=0, *outVarCols=0;
    long nNewBlocks;
    LONGLONG hrepeat=0, hoffset=0;
    tcolumn *colptr=0;
    
    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */

    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */

    if (*status > 0)
        return(*status);

    if ((infptr->Fptr)->hdutype == IMAGE_HDU || (outfptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy rows to or from IMAGE HDUs (ffcprw)");
       return(*status = NOT_TABLE);
    }

    if ( ((infptr->Fptr)->hdutype == BINARY_TBL &&  (outfptr->Fptr)->hdutype == ASCII_TBL) ||
         ((infptr->Fptr)->hdutype == ASCII_TBL &&  (outfptr->Fptr)->hdutype == BINARY_TBL) )
    {
       ffpmsg
       ("Copying rows between Binary and ASCII tables is not supported (ffcprw)");
       return(*status = NOT_BTABLE);
    }

    ffgkyjj(infptr,  "NAXIS1", &innaxis1,  0, status);  /* width of input rows */
    ffgkyjj(infptr,  "NAXIS2", &innaxis2,  0, status);  /* no. of input rows */
    ffgkyjj(outfptr, "NAXIS1", &outnaxis1, 0, status);  /* width of output rows */
    ffgkyjj(outfptr, "NAXIS2", &outnaxis2, 0, status);  /* no. of output rows */

    if (*status > 0)
        return(*status);

    if (outnaxis1 != innaxis1) {
       ffpmsg
       ("Input and output tables do not have same width (ffcprw)");
       return(*status = BAD_ROW_WIDTH);
    }    

    if (firstrow + nrows - 1 > innaxis2) {
       ffpmsg
       ("Not enough rows in input table to copy (ffcprw)");
       return(*status = BAD_ROW_NUM);
    }
    
    if ((infptr->Fptr)->tfield != (outfptr->Fptr)->tfield)
    {
       ffpmsg
       ("Input and output tables do not have same number of columns (ffcprw)");
       return(*status = BAD_COL_NUM);
    }
    
    /* allocate buffer to hold 1 row of data */
    buffer = malloc( (size_t) innaxis1);
    if (!buffer) {
       ffpmsg
       ("Unable to allocate memory (ffcprw)");
       return(*status = MEMORY_ALLOCATION);
    }
 
    inVarCols = malloc(infptr->Fptr->tfield*sizeof(int));
    outVarCols = malloc(outfptr->Fptr->tfield*sizeof(int));
    fffvcl(infptr, &nInVarCols, inVarCols, status);
    fffvcl(outfptr, &nOutVarCols, outVarCols, status);
    if (nInVarCols != nOutVarCols)
       varColDiff=1;
    else
    {
       for (ii=0; ii<nInVarCols; ++ii)
       {
          if (inVarCols[ii] != outVarCols[ii])
          {
             varColDiff=1;
             break;
          }
       }
    }
    
    if (varColDiff)
    {
       ffpmsg("Input and output tables have different variable columns (ffcprw)");
       *status = BAD_COL_NUM;
       goto CLEANUP_RETURN;
    }
    
    jj = outnaxis2 + 1;
    if (nInVarCols)
    {
       ffirow(outfptr, outnaxis2, nrows, status);
       for (ii = firstrow; ii < firstrow + nrows; ii++)
       {
          fits_read_tblbytes (infptr, ii, 1, innaxis1, buffer, status);
          fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
          /* Now make corrections for variable length columns */
          iVarCol=0;
          colptr = (infptr->Fptr)->tableptr;
          for (icol=0; icol<(infptr->Fptr)->tfield; ++icol)
          {
             if (iVarCol < nInVarCols && inVarCols[iVarCol] == icol+1)
             {
                /* Copy from a variable length column */
                
                ffgdesll(infptr, icol+1, ii, &hrepeat, &hoffset, status);
                /* If this is a bit column, hrepeat will be number of
                   bits, not bytes. If it is a string column, hrepeat
		   is the number of bytes, twidth is the max col width 
		   and can be ignored.*/
                if (colptr->tdatatype == -TBIT)
		{
		   nVarBytes = (hrepeat+7)/8;
		}
		else if (colptr->tdatatype == -TSTRING)
		{
		   nVarBytes = hrepeat;
		}
		else
		{
		   nVarBytes = hrepeat*colptr->twidth*sizeof(char);
		}
                inPos = (infptr->Fptr)->datastart + (infptr->Fptr)->heapstart
				+ hoffset;
		outPos = (outfptr->Fptr)->datastart + (outfptr->Fptr)->heapstart
				+ (outfptr->Fptr)->heapsize;
                ffmbyt(infptr, inPos, REPORT_EOF, status);
		/* If this is not the last HDU in the file, then check if */
		/* extending the heap would overwrite the following header. */
		/* If so, then have to insert more blocks. */
                if ( !((outfptr->Fptr)->lasthdu) )
                {
		   if (outPos+nVarBytes > 
		      (outfptr->Fptr)->headstart[(outfptr->Fptr)->curhdu+1])
		   {
		      nNewBlocks = (long)(((outPos+nVarBytes - 1 -
                        (outfptr->Fptr)->headstart[(outfptr->Fptr)->
                        curhdu+1]) / 2880) + 1);
                      if (ffiblk(outfptr, nNewBlocks, 1, status) > 0)
                      {
                         ffpmsg("Failed to extend the size of the variable length heap (ffcprw)");
			 goto CLEANUP_RETURN;
                      }

		   }
                }
                if (nVarBytes)
		{
		   if (nVarBytes > nVarAllocBytes)
		   {
		     /* Grow the copy buffer to accomodate the new maximum size. 
			Note it is safe to call realloc() with null input pointer, 
			which is equivalent to malloc(). */
		     unsigned char *varColBuff1 = (unsigned char *) realloc(varColBuff, nVarBytes);
		     if (! varColBuff1)
		     {
		       *status = MEMORY_ALLOCATION;
		       ffpmsg("failed to allocate memory for variable column copy (ffcprw)");
		       goto CLEANUP_RETURN;
		     }
		     /* Record the new state */
		     varColBuff = varColBuff1;
		     nVarAllocBytes = nVarBytes;
		   }
		   /* Copy date from input to output */
                   ffgbyt(infptr, nVarBytes, varColBuff, status);
		   ffmbyt(outfptr, outPos, IGNORE_EOF, status);
                   ffpbyt(outfptr, nVarBytes, varColBuff, status);
		}
		ffpdes(outfptr, icol+1, jj, hrepeat, (outfptr->Fptr)->heapsize, status);
                (outfptr->Fptr)->heapsize += nVarBytes;
                ++iVarCol;
             }
             ++colptr;
          }
          ++jj;
       }
    }
    else
    {    
       /* copy the rows, 1 at a time */
       for (ii = firstrow; ii < firstrow + nrows; ii++) {
           fits_read_tblbytes (infptr,  ii, 1, innaxis1, buffer, status);
           fits_write_tblbytes(outfptr, jj, 1, innaxis1, buffer, status);
           jj++;
       }
    }
    outnaxis2 += nrows;
    fits_update_key(outfptr, TLONGLONG, "NAXIS2", &outnaxis2, 0, status);

 CLEANUP_RETURN:
    free(buffer);
    free(inVarCols);
    free(outVarCols);
    if (varColBuff) free(varColBuff);
    return(*status);
}